

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Literal(Compiler *this,Rune r,bool foldcase)

{
  uint uVar1;
  undefined8 in_RAX;
  Frag a;
  Frag b;
  ulong uVar2;
  uint8 buf [4];
  Rune local_38;
  undefined4 local_34;
  
  _local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),r);
  if (this->encoding_ == kEncodingUTF8) {
    if (0x7f < r) {
      uVar1 = runetochar((char *)&local_34,&local_38);
      a = ByteRange(this,(uint)(byte)local_34,(uint)(byte)local_34,false);
      if (1 < (int)uVar1) {
        uVar2 = 1;
        do {
          b = ByteRange(this,(uint)*(byte *)((long)&local_34 + uVar2),
                        (uint)*(byte *)((long)&local_34 + uVar2),false);
          a = Cat(this,a,b);
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      uVar2 = (ulong)a & 0xffffffff00000000;
      goto LAB_00124cf9;
    }
    a = ByteRange(this,r,r,foldcase);
  }
  else {
    if (this->encoding_ != kEncodingLatin1) {
      uVar2 = 0;
      a.begin = 0;
      a.end.p = 0;
      goto LAB_00124cf9;
    }
    a = ByteRange(this,r,r,foldcase);
  }
  uVar2 = (ulong)a & 0xffffffff00000000;
LAB_00124cf9:
  return (Frag)((ulong)a & 0xffffffff | uVar2);
}

Assistant:

Frag Compiler::Literal(Rune r, bool foldcase) {
  switch (encoding_) {
    default:
      return Frag();

    case kEncodingLatin1:
      return ByteRange(r, r, foldcase);

    case kEncodingUTF8: {
      if (r < Runeself)  // Make common case fast.
        return ByteRange(r, r, foldcase);
      uint8 buf[UTFmax];
      int n = runetochar(reinterpret_cast<char*>(buf), &r);
      Frag f = ByteRange((uint8)buf[0], buf[0], false);
      for (int i = 1; i < n; i++)
        f = Cat(f, ByteRange((uint8)buf[i], buf[i], false));
      return f;
    }
  }
}